

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

PersistentRowGroupData * __thiscall
duckdb::RowGroup::SerializeRowGroupInfo
          (PersistentRowGroupData *__return_storage_ptr__,RowGroup *this)

{
  pointer psVar1;
  ColumnData *pCVar2;
  pointer this_00;
  PersistentColumnData local_70;
  
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_data).
  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (this->columns).
            super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
            .
            super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->columns).
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != psVar1) {
    do {
      pCVar2 = shared_ptr<duckdb::ColumnData,_true>::operator->(this_00);
      (*pCVar2->_vptr_ColumnData[0x1f])(&local_70,pCVar2);
      ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
      emplace_back<duckdb::PersistentColumnData>
                (&(__return_storage_ptr__->column_data).
                  super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ,&local_70);
      PersistentColumnData::~PersistentColumnData(&local_70);
      this_00 = this_00 + 1;
    } while (this_00 != psVar1);
  }
  __return_storage_ptr__->start = (this->super_SegmentBase<duckdb::RowGroup>).start;
  __return_storage_ptr__->count =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  return __return_storage_ptr__;
}

Assistant:

PersistentRowGroupData RowGroup::SerializeRowGroupInfo() const {
	// all columns are persistent - serialize
	PersistentRowGroupData result;
	for (auto &col : columns) {
		result.column_data.push_back(col->Serialize());
	}
	result.start = start;
	result.count = count;
	return result;
}